

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O2

void __thiscall Translator::visit(Translator *this,VarDeclNode *varDeclNode)

{
  VarSymbol *pVVar1;
  Variable *this_00;
  IdListNode *pIVar2;
  uint uVar3;
  
  do {
    if (varDeclNode == (VarDeclNode *)0x0) {
      return;
    }
    if (varDeclNode->type == (TypeNode *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (uint)(varDeclNode->type->id->token == 10);
    }
    pIVar2 = varDeclNode->idlist;
    if (pIVar2 != (IdListNode *)0x0) {
      for (; pIVar2 != (IdListNode *)0x0; pIVar2 = pIVar2->next) {
        if ((pIVar2->pointer != (PointerNode *)0x0) || (pIVar2->array != (ArrayNode *)0x0)) {
          uVar3 = 1;
        }
        if (this->activeFunction == (FunctionSymbol *)0x0) {
LAB_0011526f:
          pVVar1 = VarTable::cSearch(this->varTable,(pIVar2->id->super_ExpNode).lexeme);
          if (pVVar1 != (VarSymbol *)0x0) {
            this_00 = (Variable *)operator_new(0x18);
            Variable::Variable(this_00,pVVar1->type->id->token,pVVar1->size);
            goto LAB_001152aa;
          }
        }
        else {
          pVVar1 = VarTable::searchInScope
                             (this->varTable,(pIVar2->id->super_ExpNode).lexeme,
                              (this->activeFunction->super_Symbol).lexeme);
          if (pVVar1 == (VarSymbol *)0x0) goto LAB_0011526f;
          (*(this->currentFrame->super_Frame)._vptr_Frame[1])
                    (this->currentFrame,(ulong)uVar3,(ulong)(uint)pVVar1->size);
          this_00 = (Variable *)operator_new(0x18);
          Variable::Variable(this_00,pVVar1->type->id->token,pVVar1->size);
LAB_001152aa:
          (this_00->super_Fragment).next = this->fragmentList;
          this->fragmentList = &this_00->super_Fragment;
        }
      }
    }
    varDeclNode = varDeclNode->next;
  } while( true );
}

Assistant:

void Translator::visit(VarDeclNode *varDeclNode) {
    VarDeclNode *varDeclNodeAUX = varDeclNode;
    bool escape;
    while (varDeclNodeAUX) {
        escape = false;
        if (varDeclNodeAUX->getType() &&
            varDeclNodeAUX->getType()->getId()->getToken() == ID)// se o tipo da variavel declarada for um ID
        {
            escape = true;
        }
        if (varDeclNodeAUX->getIdList()) {
            IdListNode *idListNodeAUX = varDeclNodeAUX->getIdList();
            while (idListNodeAUX) {
                if (idListNodeAUX->getPointer() || idListNodeAUX->getArray())//se for array ou ponteiro
                {
                    escape = true;
                }
                // buscar na tabela para saber se eh local ou global
                VarSymbol *varSymbol = NULL;
                if (this->activeFunction) {
                    varSymbol = varTable->searchInScope(idListNodeAUX->getId()->getLexeme(),
                                                        activeFunction->getLexeme());
                }

                if (varSymbol)//local
                {
                    //TODO getSize ou getOffset?, verificar se o bool de escapa ta certo
                    this->currentFrame->addLocal(escape, varSymbol->getSize());
                    Variable *variable = new Variable(varSymbol->getType()->getType(), varSymbol->getSize());
                    variable->setNext(fragmentList);
                    fragmentList = variable;
                } else//global
                {
                    varSymbol = varTable->cSearch(idListNodeAUX->getId()->getLexeme());
                    if (varSymbol) {
                        Variable *variable = new Variable(varSymbol->getType()->getType(), varSymbol->getSize());
                        variable->setNext(fragmentList);
                        fragmentList = variable;
                    }
                }
                idListNodeAUX = idListNodeAUX->getNext();
            }
        }
        varDeclNodeAUX = varDeclNodeAUX->getNext();
    }
}